

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

void __thiscall luna::GC::SweepGeneration(GC *this,GenInfo *gen)

{
  byte bVar1;
  GCObject *__args;
  GCObject *pGVar2;
  
  pGVar2 = (GCObject *)0x0;
  while (__args = gen->gen_, __args != (GCObject *)0x0) {
    gen->gen_ = __args->next_;
    bVar1 = __args->field_0x10;
    if ((bVar1 & 0xc) == 4) {
      __args->field_0x10 = bVar1 & 0xf3;
      __args->next_ = pGVar2;
      pGVar2 = __args;
    }
    else {
      std::function<void_(luna::GCObject_*,_unsigned_int)>::operator()
                (&this->obj_deleter_,__args,(uint)(bVar1 >> 4));
      gen->count_ = gen->count_ - 1;
    }
  }
  gen->gen_ = pGVar2;
  return;
}

Assistant:

void GC::SweepGeneration(GenInfo &gen)
    {
        GCObject *alived = nullptr;

        while (gen.gen_)
        {
            GCObject *obj = gen.gen_;
            gen.gen_ = obj->next_;

            if (obj->gc_ == GCFlag_Black)
            {
                obj->gc_ = GCFlag_White;
                obj->next_ = alived;
                alived = obj;
            }
            else
            {
                obj_deleter_(obj, obj->gc_obj_type_);
                gen.count_--;
            }
        }

        gen.gen_ = alived;
    }